

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockrange.h
# Opt level: O0

CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
 __thiscall
snmalloc::LockRange::
Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
::alloc_range(Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
              *this,size_t size)

{
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  result;
  void *local_20;
  Atomic<CombiningLockNode_*>_conflict local_18;
  
  local_18._M_b._M_p = (__base_type)&local_20;
  local_20 = (void *)0x0;
  with<snmalloc::LockRange::Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4ul>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24ul,63ul,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,12ul>::Type<snmalloc::SubRange<snmalloc::PALLinux,6ul>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2ul>::Type<snmalloc::LargeBuddyRange<24ul,63ul,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,14ul>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>>::Type<snmalloc::PalRange<snmalloc::PALLinux>>>>>>>>>>>>>>>::alloc_range(unsigned_long)::_lambda()_1_>
            ((CombiningLock *)local_18._M_b._M_p,(anon_class_24_3_e23fe4e7_for_f_conflict1 *)0x0);
  return (CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          )local_20;
}

Assistant:

CapPtr<void, ChunkBounds> alloc_range(size_t size)
      {
        CapPtr<void, ChunkBounds> result;
        with(spin_lock, [&]() {
          {
            result = parent.alloc_range(size);
          }
        });
        return result;
      }